

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O2

QListWidgetItem * __thiscall QListWidget::takeItem(QListWidget *this,int row)

{
  long lVar1;
  QListWidgetPrivate *this_00;
  int iVar2;
  QListModel *this_01;
  QListWidgetItem *pQVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < row) {
    this_00 = *(QListWidgetPrivate **)
               &(this->super_QListView).super_QAbstractItemView.super_QAbstractScrollArea.
                super_QFrame.super_QWidget.field_0x8;
    iVar2 = (**(code **)(*(long *)(this_00->super_QListViewPrivate).super_QAbstractItemViewPrivate.
                                  model + 0x78))();
    if (row < iVar2) {
      this_01 = QListWidgetPrivate::listModel(this_00);
      pQVar3 = QListModel::take(this_01,row);
      goto LAB_00521ae2;
    }
  }
  pQVar3 = (QListWidgetItem *)0x0;
LAB_00521ae2:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QListWidgetItem *QListWidget::takeItem(int row)
{
    Q_D(QListWidget);
    if (row < 0 || row >= d->model->rowCount())
        return nullptr;
    return d->listModel()->take(row);
}